

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O0

string * webfront::base64::detail::encode_abi_cxx11_(uint8_t *input,size_t size)

{
  bool bVar1;
  const_reference pvVar2;
  reference pcVar3;
  ulong in_RDX;
  __const_iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  iterator coded;
  string *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff30;
  value_type in_stack_ffffffffffffff31;
  value_type in_stack_ffffffffffffff32;
  value_type in_stack_ffffffffffffff33;
  value_type in_stack_ffffffffffffff34;
  value_type in_stack_ffffffffffffff35;
  value_type in_stack_ffffffffffffff36;
  value_type in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ulong local_40;
  char *local_38;
  undefined1 local_19;
  ulong local_18;
  
  local_19 = 0;
  __position._M_current = (char *)((in_RDX * 4 + 8) / 3);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffe6;
  this = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(size_type)__position._M_current,(char)((ulong)this >> 0x38),
             (allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  local_38 = (char *)http::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_ffffffffffffff28);
  for (local_40 = 0; local_40 < local_18 - 2; local_40 = local_40 + 3) {
    pvVar2 = http::std::array<char,_64UL>::operator[]
                       ((array<char,_64UL> *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                        (size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff34 = *pvVar2;
    local_48 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_48);
    *pcVar3 = in_stack_ffffffffffffff34;
    pvVar2 = http::std::array<char,_64UL>::operator[]
                       ((array<char,_64UL> *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                        (size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff35 = *pvVar2;
    local_50 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    *pcVar3 = in_stack_ffffffffffffff35;
    pvVar2 = http::std::array<char,_64UL>::operator[]
                       ((array<char,_64UL> *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                        (size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff36 = *pvVar2;
    local_58 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_58);
    *pcVar3 = in_stack_ffffffffffffff36;
    pvVar2 = http::std::array<char,_64UL>::operator[]
                       ((array<char,_64UL> *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                        (size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff37 = *pvVar2;
    local_60 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_60);
    *pcVar3 = in_stack_ffffffffffffff37;
  }
  if (local_40 < local_18) {
    pvVar2 = http::std::array<char,_64UL>::operator[]
                       ((array<char,_64UL> *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                        (size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff33 = *pvVar2;
    local_68 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_68);
    *pcVar3 = in_stack_ffffffffffffff33;
    if (local_40 == local_18 - 1) {
      pvVar2 = http::std::array<char,_64UL>::operator[]
                         ((array<char,_64UL> *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT15(in_stack_ffffffffffffff35,
                                                     CONCAT14(in_stack_ffffffffffffff34,
                                                              CONCAT13(in_stack_ffffffffffffff33,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                          (size_type)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff32 = *pvVar2;
      local_70 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_RDI,
                              CONCAT13(in_stack_ffffffffffffff37,
                                       CONCAT12(in_stack_ffffffffffffff36,
                                                CONCAT11(in_stack_ffffffffffffff35,
                                                         in_stack_ffffffffffffff34))));
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      *pcVar3 = in_stack_ffffffffffffff32;
      local_78 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_RDI,
                              CONCAT13(in_stack_ffffffffffffff37,
                                       CONCAT12(in_stack_ffffffffffffff36,
                                                CONCAT11(in_stack_ffffffffffffff35,
                                                         in_stack_ffffffffffffff34))));
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_78);
      *pcVar3 = '=';
    }
    else {
      pvVar2 = http::std::array<char,_64UL>::operator[]
                         ((array<char,_64UL> *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT15(in_stack_ffffffffffffff35,
                                                     CONCAT14(in_stack_ffffffffffffff34,
                                                              CONCAT13(in_stack_ffffffffffffff33,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                          (size_type)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff30 = *pvVar2;
      local_80 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_RDI,
                              CONCAT13(in_stack_ffffffffffffff37,
                                       CONCAT12(in_stack_ffffffffffffff36,
                                                CONCAT11(in_stack_ffffffffffffff35,
                                                         in_stack_ffffffffffffff34))));
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      *pcVar3 = in_stack_ffffffffffffff30;
      pvVar2 = http::std::array<char,_64UL>::operator[]
                         ((array<char,_64UL> *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT15(in_stack_ffffffffffffff35,
                                                     CONCAT14(in_stack_ffffffffffffff34,
                                                              CONCAT13(in_stack_ffffffffffffff33,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                          (size_type)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff31 = *pvVar2;
      local_88 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_RDI,
                              CONCAT13(in_stack_ffffffffffffff37,
                                       CONCAT12(in_stack_ffffffffffffff36,
                                                CONCAT11(in_stack_ffffffffffffff35,
                                                         in_stack_ffffffffffffff34))));
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_88);
      *pcVar3 = in_stack_ffffffffffffff31;
    }
    local_90 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,
                                              CONCAT11(in_stack_ffffffffffffff35,
                                                       in_stack_ffffffffffffff34))));
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_90);
    *pcVar3 = '=';
  }
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(in_RDI)
  ;
  bVar1 = __gnu_cxx::
          operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT15(in_stack_ffffffffffffff35,
                                                   CONCAT14(in_stack_ffffffffffffff34,
                                                            CONCAT13(in_stack_ffffffffffffff33,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff32,
                                                  CONCAT11(in_stack_ffffffffffffff31,
                                                           in_stack_ffffffffffffff30))))))),
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffff37,
                           CONCAT16(in_stack_ffffffffffffff36,
                                    CONCAT15(in_stack_ffffffffffffff35,
                                             CONCAT14(in_stack_ffffffffffffff34,
                                                      CONCAT13(in_stack_ffffffffffffff33,
                                                               CONCAT12(in_stack_ffffffffffffff32,
                                                                        CONCAT11(
                                                  in_stack_ffffffffffffff31,
                                                  in_stack_ffffffffffffff30))))))),
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff28);
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (this,__position);
  }
  return in_RDI;
}

Assistant:

[[nodiscard]]inline std::string encode(const uint8_t* input, size_t size) {
    static constexpr std::array code = {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
                                    'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r',
                                    's', 't', 'u', 'v', 'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'};

    std::string output((4 * (size + 2) / 3), '\0');
    auto coded = output.begin();
    size_t i = 0;
    for (; i < size - 2; i += 3) {
        *coded++ = code[(input[i] >> 2) & 0x3Fu];
        *coded++ = code[((input[i] & 0x3u) << 4) | ((input[i + 1] & 0xF0u) >> 4)];
        *coded++ = code[((input[i + 1] & 0xFu) << 2) | ((input[i + 2] & 0xC0u) >> 6)];
        *coded++ = code[input[i + 2] & 0x3Fu];
    }
    if (i < size) {
        *coded++ = code[static_cast<size_t>(input[i] >> 2) & 0x3Fu];
        if (i == (size - 1)) {
            *coded++ = code[static_cast<size_t>(input[i] & 0x3u) << 4];
            *coded++ = '=';
        }
        else {
            *coded++ = code[static_cast<size_t>((input[i] & 0x3u) << 4 | ((input[i + 1] & 0xF0u) >> 4)) & 0x3Fu];
            *coded++ = code[static_cast<size_t>((input[i + 1] & 0xFu) << 2) & 0x3Fu];
        }
        *coded++ = '=';
    }
    if (coded != output.end()) output.erase(coded);

    return output;
}